

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_compress.c
# Opt level: O2

int archive_compressor_compress_open(archive_write_filter *f)

{
  archive *a;
  undefined1 auVar1 [16];
  uint uVar2;
  void *__ptr;
  undefined2 *puVar3;
  size_t __size;
  
  f->code = 3;
  f->name = "compress";
  __ptr = calloc(1,0x65190);
  a = f->archive;
  if (__ptr == (void *)0x0) {
    archive_set_error(a,0xc,"Can\'t allocate data for compression");
  }
  else {
    __size = 0x10000;
    if (a->magic == 0xb0c5c0de) {
      uVar2 = archive_write_get_bytes_per_block(a);
      __size = (long)(int)uVar2;
      if ((uVar2 < 0x10001) && (__size = 0x10000, uVar2 != 0)) {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (long)(int)uVar2;
        __size = 0x10000 - SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x10000)) % auVar1,0);
      }
    }
    *(size_t *)((long)__ptr + 0x65180) = __size;
    puVar3 = (undefined2 *)malloc(__size);
    *(undefined2 **)((long)__ptr + 0x65178) = puVar3;
    if (puVar3 != (undefined2 *)0x0) {
      f->write = archive_compressor_compress_write;
      f->close = archive_compressor_compress_close;
      f->free = archive_compressor_compress_free;
      *(undefined4 *)((long)__ptr + 0x20) = 0x10000;
      *(undefined8 *)((long)__ptr + 8) = 3;
      *(undefined8 *)((long)__ptr + 0x10) = 10000;
      *(undefined8 *)((long)__ptr + 0x18) = 0x1ff00000009;
      *(undefined4 *)((long)__ptr + 0x6515c) = 0x101;
      memset((void *)((long)__ptr + 0x24),0xff,0x43624);
      *puVar3 = 0x9d1f;
      *(undefined1 *)(puVar3 + 1) = 0x90;
      *(undefined8 *)((long)__ptr + 0x65188) = 3;
      f->data = __ptr;
      return 0;
    }
    archive_set_error(f->archive,0xc,"Can\'t allocate data for compression buffer");
    free(__ptr);
  }
  return -0x1e;
}

Assistant:

static int
archive_compressor_compress_open(struct archive_write_filter *f)
{
	struct private_data *state;
	size_t bs = 65536, bpb;

	f->code = ARCHIVE_FILTER_COMPRESS;
	f->name = "compress";

	state = (struct private_data *)calloc(1, sizeof(*state));
	if (state == NULL) {
		archive_set_error(f->archive, ENOMEM,
		    "Can't allocate data for compression");
		return (ARCHIVE_FATAL);
	}

	if (f->archive->magic == ARCHIVE_WRITE_MAGIC) {
		/* Buffer size should be a multiple number of the of bytes
		 * per block for performance. */
		bpb = archive_write_get_bytes_per_block(f->archive);
		if (bpb > bs)
			bs = bpb;
		else if (bpb != 0)
			bs -= bs % bpb;
	}
	state->compressed_buffer_size = bs;
	state->compressed = malloc(state->compressed_buffer_size);

	if (state->compressed == NULL) {
		archive_set_error(f->archive, ENOMEM,
		    "Can't allocate data for compression buffer");
		free(state);
		return (ARCHIVE_FATAL);
	}

	f->write = archive_compressor_compress_write;
	f->close = archive_compressor_compress_close;
	f->free = archive_compressor_compress_free;

	state->max_maxcode = 0x10000;	/* Should NEVER generate this code. */
	state->in_count = 0;		/* Length of input. */
	state->bit_buf = 0;
	state->bit_offset = 0;
	state->out_count = 3;		/* Includes 3-byte header mojo. */
	state->compress_ratio = 0;
	state->checkpoint = CHECK_GAP;
	state->code_len = 9;
	state->cur_maxcode = MAXCODE(state->code_len);
	state->first_free = FIRST;

	memset(state->hashtab, 0xff, sizeof(state->hashtab));

	/* Prime output buffer with a gzip header. */
	state->compressed[0] = 0x1f; /* Compress */
	state->compressed[1] = 0x9d;
	state->compressed[2] = 0x90; /* Block mode, 16bit max */
	state->compressed_offset = 3;

	f->data = state;
	return (0);
}